

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

void __thiscall acto::core::runtime_t::join(runtime_t *this,object_t *obj)

{
  mutex *__mutex;
  long *plVar1;
  object_t *__stat_loc;
  waiter_t node;
  waiter_t local_88;
  
  __stat_loc = obj;
  plVar1 = (long *)(anonymous)::thread_context();
  if ((object_t *)*plVar1 != obj) {
    object_t::waiter_t::waiter_t(&local_88);
    __mutex = &obj->cs;
    std::mutex::lock(__mutex);
    if (obj->impl == (actor *)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    else {
      event::reset(&local_88.on_deleted);
      local_88.super_node<acto::core::object_t::waiter_t>.next = obj->waiters;
      obj->waiters = &local_88;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      event::wait(&local_88.on_deleted,__stat_loc);
    }
    std::condition_variable::~condition_variable(&local_88.on_deleted.cond_);
  }
  return;
}

Assistant:

void runtime_t::join(object_t* const obj) {
  if (thread_context.active_actor == obj) {
    return;
  }

  object_t::waiter_t node;

  {
    std::lock_guard<std::mutex> g(obj->cs);

    if (obj->impl) {
      node.on_deleted.reset();
      node.next = obj->waiters;
      obj->waiters = &node;
    } else {
      return;
    }
  }

  node.on_deleted.wait();
}